

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_14UL> *param_5)

{
  CappedArray<char,_8UL> *params;
  CappedArray<char,_14UL> local_48;
  CappedArray<char,_8UL> local_30;
  undefined8 *local_20;
  DebugComparison<unsigned_short_&,_unsigned_int> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  local_30 = tryToCharSequence<unsigned_short,kj::CappedArray<char,8ul>>((unsigned_short *)*param_2)
  ;
  params = (CappedArray<char,_8UL> *)(local_20 + 2);
  tryToCharSequence<unsigned_int,kj::CappedArray<char,14ul>>
            (&local_48,(_ *)(local_20 + 1),(uint *)local_30.content);
  concat<kj::CappedArray<char,8ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_30,params,(StringPtr *)&local_48,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}